

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

void x86ResetLabels(void)

{
  if (labels.data != (uchar **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  labels = (FastVector<unsigned_char_*,_false,_false>)ZEXT816(0);
  if (pendingJumps.data != (UnsatisfiedJump *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  pendingJumps = (FastVector<UnsatisfiedJump,_false,_false>)ZEXT816(0);
  return;
}

Assistant:

void x86ResetLabels()
{
	labels.reset();
	pendingJumps.reset();
}